

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_findfile.c
# Opt level: O2

char * findfile(char *fname,int dotscore)

{
  __uid_t __uid;
  char *pcVar1;
  char *home;
  passwd *ppVar2;
  long lVar3;
  bool bVar4;
  
  if (*fname != '\0') {
    for (lVar3 = 0; lVar3 != 0x78; lVar3 = lVar3 + 0x18) {
      pcVar1 = (char *)curl_getenv(*(undefined8 *)((long)&conf_list[0].env + lVar3));
      if (pcVar1 != (char *)0x0) {
        home = pcVar1;
        if (*pcVar1 != '\0') {
          if (*(long *)((long)&conf_list[0].append + lVar3) != 0) {
            home = (char *)curl_maprintf("%s%s",pcVar1);
            curl_free(pcVar1);
            if (home == (char *)0x0) {
              return (char *)0x0;
            }
          }
          pcVar1 = fname;
          if (((&conf_list[0].withoutdot)[lVar3] != true) ||
             (bVar4 = dotscore != 0, pcVar1 = fname + 1, dotscore = 0, bVar4)) {
            pcVar1 = checkhome(home,pcVar1,1 < (uint)dotscore);
            curl_free(home);
            if (pcVar1 != (char *)0x0) {
              return pcVar1;
            }
            goto LAB_0010d3bf;
          }
          dotscore = 0;
        }
        curl_free(home);
      }
LAB_0010d3bf:
    }
    __uid = geteuid();
    ppVar2 = getpwuid(__uid);
    if (((ppVar2 != (passwd *)0x0) && (pcVar1 = ppVar2->pw_dir, pcVar1 != (char *)0x0)) &&
       (*pcVar1 != '\0')) {
      pcVar1 = checkhome(pcVar1,fname,false);
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

char *findfile(const char *fname, int dotscore)
{
  int i;
  DEBUGASSERT(fname && fname[0]);
  DEBUGASSERT((dotscore != 1) || (fname[0] == '.'));

  if(!fname[0])
    return NULL;

  for(i = 0; conf_list[i].env; i++) {
    char *home = curl_getenv(conf_list[i].env);
    if(home) {
      char *path;
      const char *filename = fname;
      if(!home[0]) {
        curl_free(home);
        continue;
      }
      if(conf_list[i].append) {
        char *c = aprintf("%s%s", home, conf_list[i].append);
        curl_free(home);
        if(!c)
          return NULL;
        home = c;
      }
      if(conf_list[i].withoutdot) {
        if(!dotscore) {
          /* this is not looking for .curlrc, or the XDG_CONFIG_HOME was
             defined so we skip the extended check */
          curl_free(home);
          continue;
        }
        filename++; /* move past the leading dot */
        dotscore = 0; /* disable it for this check */
      }
      path = checkhome(home, filename, dotscore ? dotscore - 1 : 0);
      curl_free(home);
      if(path)
        return path;
    }
  }
#if defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
  {
    struct passwd *pw = getpwuid(geteuid());
    if(pw) {
      char *home = pw->pw_dir;
      if(home && home[0])
        return checkhome(home, fname, FALSE);
    }
  }
#endif /* PWD-stuff */
  return NULL;
}